

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O3

void pstore::command_line::
     apply_to_option<pstore::command_line::opt<bool,pstore::command_line::parser<bool,void>>&,char_const(&)[19],pstore::command_line::desc_const&,pstore::command_line::details::initializer<bool>const&>
               (opt<bool,_pstore::command_line::parser<bool,_void>_> *opt,char (*m0) [19],desc *mods
               ,initializer<bool> *mods_1)

{
  allocator local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,*m0,&local_61);
  name::name((name *)&local_60,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  option::set_name(&opt->super_option,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  option::set_description(&opt->super_option,&mods->desc_);
  opt->value_ = *mods_1->init_;
  return;
}

Assistant:

void apply_to_option (Option && opt, M0 && m0, Mods &&... mods) {
            make_modifier (std::forward<M0> (m0)).apply (std::forward<Option> (opt));
            apply_to_option (std::forward<Option> (opt), std::forward<Mods> (mods)...);
        }